

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemSizeCalculator.cpp
# Opt level: O3

void __thiscall MemSizeCalculator::calculateFunction(MemSizeCalculator *this,Function *function)

{
  pointer ppVVar1;
  iterator __position;
  Variable *this_00;
  int iVar2;
  vector<Variable_*,_std::allocator<Variable_*>_> *pvVar3;
  Variable **var;
  pointer ppVVar4;
  int local_3c;
  vector<int,std::allocator<int>> *local_38;
  
  pvVar3 = Function::getLocalVars(function);
  ppVVar4 = (pvVar3->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>)._M_impl.
            super__Vector_impl_data._M_start;
  ppVVar1 = (pvVar3->super__Vector_base<Variable_*,_std::allocator<Variable_*>_>)._M_impl.
            super__Vector_impl_data._M_finish;
  if (ppVVar4 != ppVVar1) {
    local_38 = (vector<int,std::allocator<int>> *)&function->sizes;
    do {
      iVar2 = calculateVariable(this,*ppVVar4);
      __position._M_current =
           (function->sizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_finish;
      local_3c = iVar2;
      if (__position._M_current ==
          (function->sizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
          super__Vector_impl_data._M_end_of_storage) {
        std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                  (local_38,__position,&local_3c);
      }
      else {
        *__position._M_current = iVar2;
        (function->sizes).super__Vector_base<int,_std::allocator<int>_>._M_impl.
        super__Vector_impl_data._M_finish = __position._M_current + 1;
      }
      function->size = function->size + local_3c;
      Variable::setSize(*ppVVar4,iVar2);
      this_00 = *ppVVar4;
      iVar2 = Function::getVariableOffset(function);
      Variable::setOffset(this_00,iVar2);
      ppVVar4 = ppVVar4 + 1;
    } while (ppVVar4 != ppVVar1);
  }
  iVar2 = Function::getSize(function);
  Function::setOffset(function,iVar2);
  return;
}

Assistant:

void MemSizeCalculator::calculateFunction(Function *function) {
    for (auto &var : function->getLocalVars()) {
        int variableSize = calculateVariable(var);
        function->addSize(variableSize);
        var->setSize(variableSize);
        var->setOffset(function->getVariableOffset());
    }

    function->setOffset(function->getSize());
}